

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform_utils.hpp
# Opt level: O3

string * PlatformUtilsGetSecureEnv_abi_cxx11_(string *__return_storage_ptr__,char *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  size_t sVar3;
  string *extraout_RAX;
  long *plVar4;
  long *plVar5;
  size_type *psVar6;
  string local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50 [2];
  long local_40 [2];
  
  pcVar2 = (char *)secure_getenv(name);
  if (pcVar2 != (char *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar3 = strlen(pcVar2);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + sVar3);
    return extraout_RAX;
  }
  pcVar2 = getenv(name);
  if (pcVar2 != (char *)0x0) {
    paVar1 = &local_d0.field_2;
    local_d0._M_dataplus._M_p = (pointer)paVar1;
    sVar3 = strlen(pcVar2);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,pcVar2,pcVar2 + sVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if (local_d0._M_string_length != 0) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"!!! WARNING !!! Environment variable ","");
      plVar4 = (long *)std::__cxx11::string::append((char *)local_50);
      plVar5 = plVar4 + 2;
      if ((long *)*plVar4 == plVar5) {
        local_a0 = *plVar5;
        lStack_98 = plVar4[3];
        local_b0 = &local_a0;
      }
      else {
        local_a0 = *plVar5;
        local_b0 = (long *)*plVar4;
      }
      local_a8 = plVar4[1];
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_b0);
      plVar5 = plVar4 + 2;
      if ((long *)*plVar4 == plVar5) {
        local_80 = *plVar5;
        lStack_78 = plVar4[3];
        local_90 = &local_80;
      }
      else {
        local_80 = *plVar5;
        local_90 = (long *)*plVar4;
      }
      local_88 = plVar4[1];
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
      plVar5 = plVar4 + 2;
      if ((long *)*plVar4 == plVar5) {
        local_60 = *plVar5;
        lStack_58 = plVar4[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar5;
        local_70 = (long *)*plVar4;
      }
      local_68 = plVar4[1];
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
      psVar6 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar6) {
        local_d0.field_2._M_allocated_capacity = *psVar6;
        local_d0.field_2._8_8_ = plVar4[3];
        local_d0._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *psVar6;
        local_d0._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_d0._M_string_length = plVar4[1];
      *plVar4 = (long)psVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      LogPlatformUtilsError(&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != paVar1) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      if (local_90 != &local_80) {
        operator_delete(local_90,local_80 + 1);
      }
      if (local_b0 != &local_a0) {
        operator_delete(local_b0,local_a0 + 1);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return (string *)&__return_storage_ptr__->field_2;
}

Assistant:

static inline std::string PlatformUtilsGetSecureEnv(const char* name) {
    auto str = detail::ImplGetSecureEnv(name);
    if (str == nullptr) {
        str = detail::ImplGetEnv(name);
        if (str != nullptr && !std::string(str).empty()) {
            LogPlatformUtilsError(std::string("!!! WARNING !!! Environment variable ") + name +
                                  " is being ignored due to running with secure execution. The value '" + str +
                                  "' will NOT be used.");
        }
        return {};
    }
    return str;
}